

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::FileDescriptorTables::AddAliasUnderParent
          (FileDescriptorTables *this,void *parent,string *name,Symbol symbol)

{
  __node_base *p_Var1;
  size_type *psVar2;
  pointer __s1;
  size_t size;
  _Hash_node_base *p_Var3;
  __buckets_ptr pp_Var4;
  int iVar5;
  LogMessage *pLVar6;
  _Hash_node_base *p_Var7;
  __node_ptr p_Var8;
  _Hash_node_base *p_Var9;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var10;
  ulong uVar11;
  size_type __n;
  ulong uVar12;
  _Hash_node_base _Var13;
  pointer __ptr_1;
  size_type len;
  bool bVar14;
  undefined1 auVar15 [16];
  __buckets_alloc_type __alloc;
  LogFinisher local_c9;
  undefined1 local_c8 [16];
  pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece> local_b8;
  LogMessage local_a0;
  LogMessage local_68;
  
  __s1 = (name->_M_dataplus)._M_p;
  size = name->_M_string_length;
  local_c8._0_8_ = symbol.ptr_;
  if ((long)size < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig(size,"string length exceeds max size");
  }
  Symbol::parent_name_key
            ((pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece> *)&local_a0,
             (Symbol *)local_c8);
  if (size == local_a0._16_8_) {
    bVar14 = true;
    if (size != 0 && __s1 != local_a0.filename_) {
      iVar5 = bcmp(__s1,local_a0.filename_,size);
      bVar14 = iVar5 == 0;
    }
  }
  else {
    bVar14 = false;
  }
  if (!bVar14) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x685);
    pLVar6 = internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: (name) == (symbol.parent_name_key().second): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_b8,pLVar6);
    internal::LogMessage::~LogMessage(&local_68);
  }
  pLVar6 = (LogMessage *)local_c8;
  Symbol::parent_name_key(&local_b8,(Symbol *)pLVar6);
  if (local_b8.first != parent) {
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x686);
    pLVar6 = internal::LogMessage::operator<<
                       (&local_a0,"CHECK failed: (parent) == (symbol.parent_name_key().first): ");
    internal::LogFinisher::operator=(&local_c9,pLVar6);
    internal::LogMessage::~LogMessage(&local_a0);
  }
  p_Var7 = (_Hash_node_base *)
           std::__detail::
           _Hash_code_base<google::protobuf::Symbol,_google::protobuf::Symbol,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
           ::_M_hash_code((_Hash_code_base<google::protobuf::Symbol,_google::protobuf::Symbol,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                           *)local_c8,(Symbol *)pLVar6);
  uVar11 = (ulong)p_Var7 % (this->symbols_by_parent_)._M_h._M_bucket_count;
  p_Var8 = std::
           _Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           ::_M_find_node((_Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)this,uVar11,(key_type *)local_c8,(__hash_code)p_Var7);
  if (p_Var8 == (__node_ptr)0x0) {
    p_Var9 = (_Hash_node_base *)operator_new(0x18);
    p_Var9->_M_nxt = (_Hash_node_base *)0x0;
    p_Var9[1]._M_nxt = (_Hash_node_base *)local_c8._0_8_;
    local_c8._8_8_ = (this->symbols_by_parent_)._M_h._M_rehash_policy._M_next_resize;
    auVar15 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)&(this->symbols_by_parent_)._M_h._M_rehash_policy,
                         (this->symbols_by_parent_)._M_h._M_bucket_count,
                         (this->symbols_by_parent_)._M_h._M_element_count);
    __n = auVar15._8_8_;
    if ((auVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      if (__n == 1) {
        __s = &(this->symbols_by_parent_)._M_h._M_single_bucket;
        (this->symbols_by_parent_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      }
      else {
        __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                        ((new_allocator<std::__detail::_Hash_node_base_*> *)&local_b8,__n,
                         (void *)0x0);
        memset(__s,0,__n * 8);
      }
      _Var13._M_nxt = (this->symbols_by_parent_)._M_h._M_before_begin._M_nxt;
      (this->symbols_by_parent_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      if (_Var13._M_nxt != (_Hash_node_base *)0x0) {
        p_Var1 = &(this->symbols_by_parent_)._M_h._M_before_begin;
        uVar11 = 0;
        do {
          p_Var3 = (_Var13._M_nxt)->_M_nxt;
          uVar12 = (ulong)_Var13._M_nxt[2]._M_nxt % __n;
          if (__s[uVar12] == (_Hash_node_base *)0x0) {
            (_Var13._M_nxt)->_M_nxt = p_Var1->_M_nxt;
            p_Var1->_M_nxt = _Var13._M_nxt;
            __s[uVar12] = p_Var1;
            if ((_Var13._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
              pp_Var10 = __s + uVar11;
              goto LAB_0034b129;
            }
          }
          else {
            (_Var13._M_nxt)->_M_nxt = __s[uVar12]->_M_nxt;
            pp_Var10 = &__s[uVar12]->_M_nxt;
            uVar12 = uVar11;
LAB_0034b129:
            *pp_Var10 = _Var13._M_nxt;
          }
          _Var13._M_nxt = p_Var3;
          uVar11 = uVar12;
        } while (p_Var3 != (_Hash_node_base *)0x0);
      }
      pp_Var4 = (this->symbols_by_parent_)._M_h._M_buckets;
      if (&(this->symbols_by_parent_)._M_h._M_single_bucket != pp_Var4) {
        operator_delete(pp_Var4);
      }
      (this->symbols_by_parent_)._M_h._M_bucket_count = __n;
      (this->symbols_by_parent_)._M_h._M_buckets = __s;
      uVar11 = (ulong)p_Var7 % __n;
    }
    p_Var9[2]._M_nxt = p_Var7;
    pp_Var4 = (this->symbols_by_parent_)._M_h._M_buckets;
    if (pp_Var4[uVar11] == (__node_base_ptr)0x0) {
      p_Var7 = (this->symbols_by_parent_)._M_h._M_before_begin._M_nxt;
      p_Var9->_M_nxt = p_Var7;
      (this->symbols_by_parent_)._M_h._M_before_begin._M_nxt = p_Var9;
      if (p_Var7 != (_Hash_node_base *)0x0) {
        pp_Var4[(ulong)p_Var7[2]._M_nxt % (this->symbols_by_parent_)._M_h._M_bucket_count] = p_Var9;
      }
      (this->symbols_by_parent_)._M_h._M_buckets[uVar11] =
           &(this->symbols_by_parent_)._M_h._M_before_begin;
    }
    else {
      p_Var9->_M_nxt = pp_Var4[uVar11]->_M_nxt;
      pp_Var4[uVar11]->_M_nxt = p_Var9;
    }
    psVar2 = &(this->symbols_by_parent_)._M_h._M_element_count;
    *psVar2 = *psVar2 + 1;
  }
  return p_Var8 == (__node_ptr)0x0;
}

Assistant:

bool FileDescriptorTables::AddAliasUnderParent(const void* parent,
                                               const std::string& name,
                                               Symbol symbol) {
  GOOGLE_DCHECK_EQ(name, symbol.parent_name_key().second);
  GOOGLE_DCHECK_EQ(parent, symbol.parent_name_key().first);
  return symbols_by_parent_.insert(symbol).second;
}